

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

RGB __thiscall pbrt::MIPMap::Bilerp<pbrt::RGB>(MIPMap *this,int level,Point2f st)

{
  Image *pIVar1;
  ulong uVar2;
  Float *pFVar3;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  int c;
  int c_00;
  Float FVar4;
  RGB RVar5;
  Float local_5c;
  undefined8 local_58;
  int vb;
  int va;
  Tuple2<pbrt::Point2,_float> local_48;
  
  local_48 = st.super_Tuple2<pbrt::Point2,_float>;
  if ((-1 < level) && (uVar2 = (ulong)(uint)level, uVar2 < (this->pyramid).nStored)) {
    pIVar1 = (this->pyramid).ptr;
    vb = (int)pIVar1[uVar2].channelNames.nStored;
    if (vb - 3U < 2) {
      local_58 = 0;
      local_5c = 0.0;
      c_00 = 0;
      do {
        wrapMode.wrap.values[1] = this->wrapMode;
        wrapMode.wrap.values[0] = this->wrapMode;
        FVar4 = Image::BilerpChannel((this->pyramid).ptr + uVar2,(Point2f)local_48,c_00,wrapMode);
        pFVar3 = (Float *)&local_58;
        if ((c_00 != 0) && (pFVar3 = (Float *)((long)&local_58 + 4), c_00 != 1)) {
          pFVar3 = &local_5c;
        }
        *pFVar3 = FVar4;
        c_00 = c_00 + 1;
      } while (c_00 != 3);
    }
    else {
      va = 1;
      if (vb != 1) {
        LogFatal<char_const(&)[2],char_const(&)[27],char_const(&)[2],int&,char_const(&)[27],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                   ,0x121,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x2c93cbe,
                   (char (*) [27])"pyramid[level].NChannels()",(char (*) [2])0x2c93cbe,&va,
                   (char (*) [27])"pyramid[level].NChannels()",&vb);
      }
      wrapMode_00.wrap.values[1] = this->wrapMode;
      wrapMode_00.wrap.values[0] = this->wrapMode;
      local_5c = Image::BilerpChannel(pIVar1 + uVar2,st,0,wrapMode_00);
      local_58 = CONCAT44(local_5c,local_5c);
    }
    RVar5.b = local_5c;
    RVar5.r = (Float)(undefined4)local_58;
    RVar5.g = (Float)local_58._4_4_;
    return RVar5;
  }
  LogFatal<char_const(&)[37]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
             ,0x11a,"Check failed: %s",(char (*) [37])"level >= 0 && level < pyramid.size()");
}

Assistant:

RGB MIPMap::Bilerp(int level, Point2f st) const {
    CHECK(level >= 0 && level < pyramid.size());
    if (pyramid[level].NChannels() == 3 || pyramid[level].NChannels() == 4) {
        RGB rgb;
        for (int c = 0; c < 3; ++c)
            rgb[c] = pyramid[level].BilerpChannel(st, c, wrapMode);
        return rgb;
    } else {
        CHECK_EQ(1, pyramid[level].NChannels());
        Float v = pyramid[level].BilerpChannel(st, 0, wrapMode);
        return RGB(v, v, v);
    }
}